

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

bool xercesc_4_0::XMLString::isInList(XMLCh *toFind,XMLCh *enumList)

{
  XMLSize_t XVar1;
  bool bVar2;
  ulong local_38;
  XMLSize_t testInd;
  XMLSize_t findLen;
  XMLCh *listPtr;
  XMLCh *enumList_local;
  XMLCh *toFind_local;
  
  XVar1 = stringLen(toFind);
  findLen = (XMLSize_t)enumList;
  while( true ) {
    if (*(short *)findLen == 0) {
      return false;
    }
    for (local_38 = 0;
        (local_38 < XVar1 && (*(XMLCh *)(findLen + local_38 * 2) == toFind[local_38]));
        local_38 = local_38 + 1) {
    }
    if ((local_38 == XVar1) &&
       ((*(short *)(findLen + local_38 * 2) == 0x20 || (*(short *)(findLen + local_38 * 2) == 0))))
    break;
    while( true ) {
      bVar2 = false;
      if (*(short *)findLen != 0x20) {
        bVar2 = *(short *)findLen != 0;
      }
      if (!bVar2) break;
      findLen = findLen + 2;
    }
    if (*(short *)findLen == 0) {
      return false;
    }
    findLen = findLen + 2;
  }
  return true;
}

Assistant:

bool XMLString::isInList(const XMLCh* const toFind, const XMLCh* const enumList)
{
    //
    //  We loop through the values in the list via this outer loop. We end
    //  when we hit the end of the enum list or get a match.
    //
    const XMLCh* listPtr = enumList;
    const XMLSize_t findLen = XMLString::stringLen(toFind);
    while (*listPtr)
    {
        XMLSize_t testInd;
        for (testInd = 0; testInd < findLen; testInd++)
        {
            //
            //  If they don't match, then reset and try again. Note that
            //  hitting the end of the current item will cause a mismatch
            //  because there can be no spaces in the toFind string.
            //
            if (listPtr[testInd] != toFind[testInd])
                break;
        }

        //
        //  If we went the distance, see if we matched. If we did, the current
        //  list character has to be null or space.
        //
        if (testInd == findLen)
        {
            if ((listPtr[testInd] == chSpace) || !listPtr[testInd])
                return true;
        }

        // Run the list pointer up to the next substring
        while ((*listPtr != chSpace) && *listPtr)
            listPtr++;

        // If we hit the end, then we failed
        if (!*listPtr)
            return false;

        // Else move past the space and try again
        listPtr++;
    }

    // We never found it
    return false;
}